

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::protos::gen::TrackEvent::TrackEvent(TrackEvent *this,TrackEvent *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer pbVar4;
  undefined8 uVar5;
  uint64_t uVar6;
  double dVar7;
  pointer plVar8;
  pointer pdVar9;
  pointer pDVar10;
  int64_t iVar11;
  int64_t iVar12;
  int64_t iVar13;
  int64_t iVar14;
  int64_t iVar15;
  TrackEvent_Type TVar16;
  undefined4 uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__TrackEvent_003a2650;
  puVar3 = (param_1->category_iids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3;
  (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar4 = (param_1->categories_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->categories_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  (this->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->categories_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->name_iid_ = param_1->name_iid_;
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->name_)._M_dataplus._M_p;
  paVar18 = &(param_1->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar18) {
    uVar5 = *(undefined8 *)((long)&(param_1->name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar18->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar5;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar2;
    (this->name_).field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = (param_1->name_)._M_string_length;
  (param_1->name_)._M_dataplus._M_p = (pointer)paVar18;
  (param_1->name_)._M_string_length = 0;
  (param_1->name_).field_2._M_local_buf[0] = '\0';
  TVar16 = param_1->type_;
  uVar17 = *(undefined4 *)&param_1->field_0x64;
  uVar6 = param_1->track_uuid_;
  dVar7 = param_1->double_counter_value_;
  this->counter_value_ = param_1->counter_value_;
  this->double_counter_value_ = dVar7;
  this->type_ = TVar16;
  *(undefined4 *)&this->field_0x64 = uVar17;
  this->track_uuid_ = uVar6;
  puVar3 = (param_1->extra_counter_track_uuids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (param_1->extra_counter_track_uuids_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar3;
  (this->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (param_1->extra_counter_track_uuids_).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (param_1->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (param_1->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  plVar8 = (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = plVar8;
  (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar3 = (param_1->extra_double_counter_track_uuids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (param_1->extra_double_counter_track_uuids_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar3;
  (this->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (param_1->extra_double_counter_track_uuids_).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (param_1->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (param_1->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pdVar9 = (param_1->extra_double_counter_values_).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar9;
  (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar3 = (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3;
  (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar3 = (param_1->terminating_flow_ids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->terminating_flow_ids_).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar3;
  (this->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->terminating_flow_ids_).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar10 = (param_1->debug_annotations_).
            super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (this->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->debug_annotations_).
       super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar10;
  (this->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->debug_annotations_).
       super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  protozero::CopyablePtr<perfetto::protos::gen::TaskExecution>::CopyablePtr
            (&this->task_execution_,&param_1->task_execution_);
  protozero::CopyablePtr<perfetto::protos::gen::LogMessage>::CopyablePtr
            (&this->log_message_,&param_1->log_message_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeCompositorSchedulerState>::CopyablePtr
            (&this->cc_scheduler_state_,&param_1->cc_scheduler_state_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeUserEvent>::CopyablePtr
            (&this->chrome_user_event_,&param_1->chrome_user_event_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeKeyedService>::CopyablePtr
            (&this->chrome_keyed_service_,&param_1->chrome_keyed_service_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeLegacyIpc>::CopyablePtr
            (&this->chrome_legacy_ipc_,&param_1->chrome_legacy_ipc_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeHistogramSample>::CopyablePtr
            (&this->chrome_histogram_sample_,&param_1->chrome_histogram_sample_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeLatencyInfo>::CopyablePtr
            (&this->chrome_latency_info_,&param_1->chrome_latency_info_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeFrameReporter>::CopyablePtr
            (&this->chrome_frame_reporter_,&param_1->chrome_frame_reporter_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeApplicationStateInfo>::CopyablePtr
            (&this->chrome_application_state_info_,&param_1->chrome_application_state_info_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeRendererSchedulerState>::CopyablePtr
            (&this->chrome_renderer_scheduler_state_,&param_1->chrome_renderer_scheduler_state_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeWindowHandleEventInfo>::CopyablePtr
            (&this->chrome_window_handle_event_info_,&param_1->chrome_window_handle_event_info_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeContentSettingsEventInfo>::CopyablePtr
            (&this->chrome_content_settings_event_info_,
             &param_1->chrome_content_settings_event_info_);
  protozero::CopyablePtr<perfetto::protos::gen::SourceLocation>::CopyablePtr
            (&this->source_location_,&param_1->source_location_);
  this->source_location_iid_ = param_1->source_location_iid_;
  protozero::CopyablePtr<perfetto::protos::gen::ChromeMessagePump>::CopyablePtr
            (&this->chrome_message_pump_,&param_1->chrome_message_pump_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeMojoEventInfo>::CopyablePtr
            (&this->chrome_mojo_event_info_,&param_1->chrome_mojo_event_info_);
  iVar11 = param_1->timestamp_delta_us_;
  iVar12 = param_1->timestamp_absolute_us_;
  iVar13 = param_1->thread_time_delta_us_;
  iVar14 = param_1->thread_time_absolute_us_;
  iVar15 = param_1->thread_instruction_count_absolute_;
  this->thread_instruction_count_delta_ = param_1->thread_instruction_count_delta_;
  this->thread_instruction_count_absolute_ = iVar15;
  this->thread_time_delta_us_ = iVar13;
  this->thread_time_absolute_us_ = iVar14;
  this->timestamp_delta_us_ = iVar11;
  this->timestamp_absolute_us_ = iVar12;
  protozero::CopyablePtr<perfetto::protos::gen::TrackEvent_LegacyEvent>::CopyablePtr
            (&this->legacy_event_,&param_1->legacy_event_);
  paVar1 = &(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->unknown_fields_)._M_dataplus._M_p;
  paVar18 = &(param_1->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar18) {
    uVar5 = *(undefined8 *)((long)&(param_1->unknown_fields_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar18->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->unknown_fields_).field_2 + 8) = uVar5;
  }
  else {
    (this->unknown_fields_)._M_dataplus._M_p = pcVar2;
    (this->unknown_fields_).field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
  }
  (this->unknown_fields_)._M_string_length = (param_1->unknown_fields_)._M_string_length;
  (param_1->unknown_fields_)._M_dataplus._M_p = (pointer)paVar18;
  (param_1->unknown_fields_)._M_string_length = 0;
  (param_1->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TrackEvent::TrackEvent(TrackEvent&&) noexcept = default;